

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_hmc_multiple_val.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int idim_1;
  int iVar4;
  double *pdVar5;
  time_t tVar6;
  ostream *poVar7;
  long lVar8;
  undefined1 *puVar9;
  int idim;
  double *pdVar10;
  int jdim;
  long lVar11;
  uint uVar12;
  int iVar13;
  double x [3];
  double ham_fin;
  double ham_init;
  double backup_x [3];
  double local_278;
  double dStack_270;
  double local_268;
  undefined1 local_260 [8];
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_238;
  ofstream outputfile;
  undefined8 auStack_228 [2];
  uint auStack_218 [122];
  
  pdVar5 = &dStack_270;
  local_238 = 0x4000000000000000;
  local_278 = 1.0;
  dStack_270 = 1.0;
  local_268 = 1.0;
  local_258 = 0x4000000000000000;
  uStack_250 = 0x3ff0000000000000;
  puVar9 = local_260;
  for (lVar8 = 1; lVar8 != 3; lVar8 = lVar8 + 1) {
    pdVar10 = pdVar5;
    for (lVar11 = 0; lVar8 != lVar11; lVar11 = lVar11 + 1) {
      *(double *)(puVar9 + lVar11 * 8) = *pdVar10;
      pdVar10 = pdVar10 + 3;
    }
    pdVar5 = pdVar5 + 1;
    puVar9 = puVar9 + 0x18;
  }
  tVar6 = time((time_t *)0x0);
  srand((uint)tVar6);
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    x[lVar8] = 0.0;
  }
  std::ofstream::ofstream(&outputfile,"output.txt",_S_out);
  iVar13 = 0;
  uVar12 = 0;
  while (uVar12 != 10000) {
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      backup_x[lVar8] = x[lVar8];
    }
    Molecular_Dynamics(&x,(double (*) [3])&local_278,&ham_init,&ham_fin);
    iVar4 = rand();
    dVar1 = exp(ham_init - ham_fin);
    lVar8 = std::cout;
    if (dVar1 <= (double)iVar4 / 2147483647.0) {
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        x[lVar11] = backup_x[lVar11];
      }
    }
    else {
      iVar13 = iVar13 + 1;
    }
    dVar1 = x[0];
    uVar12 = uVar12 + 1;
    if (uVar12 % 10 == 0) {
      *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(std::ofstream::close + *(long *)(lVar8 + -0x18)) = 6;
      poVar7 = std::ostream::_M_insert<double>(x[0]);
      std::operator<<(poVar7,"   ");
      dVar2 = x[1];
      poVar7 = std::ostream::_M_insert<double>(x[1]);
      std::operator<<(poVar7,"   ");
      dVar3 = x[2];
      poVar7 = std::ostream::_M_insert<double>(x[2]);
      std::operator<<(poVar7,"   ");
      poVar7 = std::ostream::_M_insert<double>((double)iVar13 / (double)(int)uVar12);
      std::endl<char,std::char_traits<char>>(poVar7);
      *(uint *)((long)auStack_218 + *(long *)(_outputfile + -0x18)) =
           *(uint *)((long)auStack_218 + *(long *)(_outputfile + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)((long)auStack_228 + *(long *)(_outputfile + -0x18)) = 6;
      poVar7 = std::ostream::_M_insert<double>(dVar1);
      std::operator<<(poVar7,"   ");
      poVar7 = std::ostream::_M_insert<double>(dVar2);
      std::operator<<(poVar7,"   ");
      poVar7 = std::ostream::_M_insert<double>(dVar3);
      std::operator<<(poVar7,"   ");
      poVar7 = std::ostream::_M_insert<double>((double)iVar13 / (double)(int)uVar12);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&outputfile);
  return 0;
}

Assistant:

int main() {
    double x[ndim];
    double A[ndim][ndim];

    A[0][0] = 1e0;
    A[1][1] = 2e0;
    A[2][2] = 2e0;
    A[0][1] = 1e0;
    A[0][2] = 1e0;
    A[1][2] = 1e0;
    for (int idim = 1; idim < ndim; idim++) {
        for (int jdim = 0; jdim < idim; jdim++) {
            A[idim][jdim] = A[jdim][idim];
        }
    }
    srand((unsigned) time(NULL));

    for (int idim = 0; idim < ndim; idim++) {
        x[idim] = 0e0;
    }

    std::ofstream outputfile("output.txt");
    int naccept = 0;

    for (int iter = 0; iter < niter; iter++) {
        double backup_x[ndim];
        for (int idim = 0; idim < ndim; idim++) {
            backup_x[idim] = x[idim];
        }
        double ham_init, ham_fin;
        Molecular_Dynamics(x, A, ham_init, ham_fin);
        double metropolis = (double) rand() / RAND_MAX;
        if (exp(ham_init - ham_fin) > metropolis) {
            naccept++;
        } else {
            for (int idim = 0; idim < ndim; idim++) {
                x[idim] = backup_x[idim];
            }
        }
        if ((iter + 1) % 10 == 0) {
            std::cout << std::fixed << std::setprecision(6)
                      << x[0] << "   "
                      << x[1] << "   "
                      << x[2] << "   "
                      << ((double) naccept) / ((double) iter + 1)
                      << std::endl;

            outputfile << std::fixed << std::setprecision(6)
                       << x[0] << "   "
                       << x[1] << "   "
                       << x[2] << "   "
                       << ((double) naccept) / ((double) iter + 1)
                       << std::endl;
        }
    }
    outputfile.close();
    return 0;
}